

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O2

LY_ERR lyds_additionally_create_rb_nodes
                 (lyd_node **first_sibling,lyd_node **leader,lyd_meta *root_meta,rb_node **rbt,
                 lyd_node *node)

{
  rb_node *rbn_00;
  LY_ERR ret__;
  LY_ERR LVar1;
  lyd_node *node_00;
  ly_bool max;
  lyd_meta *local_40;
  rb_node *rbn;
  
  local_40 = root_meta;
  while( true ) {
    node_00 = node;
    if (node_00 == (lyd_node *)0x0) {
      return LY_SUCCESS;
    }
    if (node_00->schema != (*leader)->schema) break;
    node = node_00->next;
    LVar1 = lyds_create_node(node_00,&rbn);
    rbn_00 = rbn;
    if (LVar1 != LY_SUCCESS) {
      return LY_EMEM;
    }
    rb_insert_node(rbt,rbn,&max);
    if (max == '\0') {
      lyd_unlink_ignore_lyds(first_sibling,node_00);
      lyds_link_data_node(first_sibling,leader,node_00,local_40,rbn_00);
      lyd_insert_hash(node_00);
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyds_additionally_create_rb_nodes(struct lyd_node **first_sibling, struct lyd_node **leader,
        struct lyd_meta *root_meta, struct rb_node **rbt, struct lyd_node *node)
{
    LY_ERR ret;
    ly_bool max;
    struct rb_node *rbn;
    struct lyd_node *iter, *next;

    for (iter = node; iter && (iter->schema == (*leader)->schema); iter = next) {
        next = iter->next;
        ret = lyds_create_node(iter, &rbn);
        LY_CHECK_RET(ret);
        rb_insert_node(rbt, rbn, &max);
        if (!max) {
            /* nodes were not sorted, they will be sorted now */
            lyd_unlink_ignore_lyds(first_sibling, iter);
            lyds_link_data_node(first_sibling, leader, iter, root_meta, rbn);
            lyd_insert_hash(iter);
        }
    }

    return LY_SUCCESS;
}